

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::CodeGeneratorResponse::ByteSize(CodeGeneratorResponse *this)

{
  bool bVar1;
  int iVar2;
  string *value;
  CodeGeneratorResponse_File *value_00;
  UnknownFieldSet *pUVar3;
  int local_18;
  int local_14;
  int i;
  int total_size;
  CodeGeneratorResponse *this_local;
  
  local_14 = 0;
  if (((this->_has_bits_[0] & 0xff) != 0) && (bVar1 = has_error(this), bVar1)) {
    value = error_abi_cxx11_(this);
    local_14 = internal::WireFormatLite::StringSize(value);
    local_14 = local_14 + 1;
  }
  iVar2 = file_size(this);
  local_14 = iVar2 + local_14;
  for (local_18 = 0; iVar2 = file_size(this), local_18 < iVar2; local_18 = local_18 + 1) {
    value_00 = file(this,local_18);
    iVar2 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::compiler::CodeGeneratorResponse_File>(value_00);
    local_14 = iVar2 + local_14;
  }
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar3);
    local_14 = iVar2 + local_14;
  }
  this->_cached_size_ = local_14;
  return local_14;
}

Assistant:

int CodeGeneratorResponse::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string error = 1;
    if (has_error()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->error());
    }

  }
  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  total_size += 1 * this->file_size();
  for (int i = 0; i < this->file_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->file(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}